

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O3

RGBA tcu::computeAbsDiffMasked(RGBA a,RGBA b,deUint32 cmpMask)

{
  uint uVar1;
  uint uVar3;
  deUint32 bPacked;
  deUint32 aPacked;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar2;
  
  uVar1 = 0;
  uVar3 = 0;
  if ((cmpMask & 1) != 0) {
    uVar4 = (a.m_value & 0xff) - (b.m_value & 0xff);
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
  }
  if ((cmpMask & 2) != 0) {
    iVar5 = (a.m_value >> 8 & 0xff) - (b.m_value >> 8 & 0xff);
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    uVar1 = iVar2 << 8;
  }
  uVar4 = 0;
  uVar6 = 0;
  if ((cmpMask & 4) != 0) {
    iVar5 = (a.m_value >> 0x10 & 0xff) - (b.m_value >> 0x10 & 0xff);
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    uVar6 = iVar2 << 0x10;
  }
  if ((cmpMask & 8) != 0) {
    iVar5 = (a.m_value >> 0x18) - (b.m_value >> 0x18);
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    uVar4 = iVar2 << 0x18;
  }
  return (RGBA)(uVar1 | uVar3 | uVar6 | uVar4);
}

Assistant:

RGBA computeAbsDiffMasked (RGBA a, RGBA b, deUint32 cmpMask)
{
	deUint32	aPacked = a.getPacked();
	deUint32	bPacked = b.getPacked();
	deUint8		rDiff	= 0;
	deUint8		gDiff	= 0;
	deUint8		bDiff	= 0;
	deUint8		aDiff	= 0;

	if (cmpMask & RGBA::RED_MASK)
	{
		int ra = (aPacked >> RGBA::RED_SHIFT) & 0xFF;
		int rb = (bPacked >> RGBA::RED_SHIFT) & 0xFF;

		rDiff = (deUint8)deAbs32(ra - rb);
	}

	if (cmpMask & RGBA::GREEN_MASK)
	{
		int ga = (aPacked >> RGBA::GREEN_SHIFT) & 0xFF;
		int gb = (bPacked >> RGBA::GREEN_SHIFT) & 0xFF;

		gDiff = (deUint8)deAbs32(ga - gb);
	}

	if (cmpMask & RGBA::BLUE_MASK)
	{
		int ba = (aPacked >> RGBA::BLUE_SHIFT) & 0xFF;
		int bb = (bPacked >> RGBA::BLUE_SHIFT) & 0xFF;

		bDiff = (deUint8)deAbs32(ba - bb);
	}

	if (cmpMask & RGBA::ALPHA_MASK)
	{
		int aa = (aPacked >> RGBA::ALPHA_SHIFT) & 0xFF;
		int ab = (bPacked >> RGBA::ALPHA_SHIFT) & 0xFF;

		aDiff = (deUint8)deAbs32(aa - ab);
	}

	return RGBA(rDiff,gDiff,bDiff,aDiff);
}